

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_remote_port(Curl_easy *data,connectdata *conn)

{
  unsigned_short uVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long ulnum;
  char *pcVar4;
  char *pcVar5;
  uint local_74;
  long port;
  char *rest;
  char type [12];
  char *url;
  in6_addr in6;
  char endbracket;
  char *portptr;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  iVar2 = __isoc99_sscanf((conn->host).name,"[%*45[0123456789abcdefABCDEF:.]%c",
                          (undefined1 *)((long)&in6.__in6_u + 0xb));
  if ((iVar2 == 1) && (in6.__in6_u.__u6_addr8[0xb] == ']')) {
    (conn->bits).ipv6_ip = true;
    (conn->host).name = (conn->host).name + 1;
    pcVar3 = strchr((conn->host).name,0x5d);
    unique0x1000049f = pcVar3;
    if (pcVar3 != (char *)0x0) {
      register0x00000008 = pcVar3 + 1;
      *pcVar3 = '\0';
      if (*register0x00000008 != ':') {
        stack0xffffffffffffffd8 = (char *)0x0;
      }
    }
  }
  else {
    iVar2 = inet_pton(10,(conn->host).name,(void *)((long)&url + 4));
    if (0 < iVar2) {
      Curl_failf(data,"IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
    register0x00000000 = strrchr((conn->host).name,0x3a);
  }
  if (((data->set).use_port == 0) || (((data->state).allow_port & 1U) == 0)) {
    if (stack0xffffffffffffffd8 != (char *)0x0) {
      ulnum = strtol(stack0xffffffffffffffd8 + 1,(char **)&port,10);
      if (((long)ulnum < 0) || (0xffff < (long)ulnum)) {
        Curl_failf(data,"Port number out of range");
        return CURLE_URL_MALFORMAT;
      }
      if ((char *)port == stack0xffffffffffffffd8 + 1) {
        *stack0xffffffffffffffd8 = '\0';
      }
      else {
        *stack0xffffffffffffffd8 = '\0';
        uVar1 = curlx_ultous(ulnum);
        conn->remote_port = (uint)uVar1;
      }
    }
  }
  else {
    conn->remote_port = (uint)(data->set).use_port & 0xffff;
    if (stack0xffffffffffffffd8 != (char *)0x0) {
      *stack0xffffffffffffffd8 = '\0';
    }
    if (((conn->bits).httpproxy & 1U) != 0) {
      memset((void *)((long)&rest + 4),0,0xc);
      if (((conn->bits).type_set & 1U) != 0) {
        if (((data->set).prefer_ascii & 1U) == 0) {
          local_74 = 0x49;
          if (((data->set).ftp_list_only & 1U) != 0) {
            local_74 = 0x44;
          }
        }
        else {
          local_74 = 0x41;
        }
        curl_msnprintf((char *)((long)&rest + 4),0xc,";type=%c",(ulong)local_74);
      }
      pcVar3 = "";
      if (((conn->bits).ipv6_ip & 1U) != 0) {
        pcVar3 = "[";
      }
      pcVar4 = "";
      if (((conn->bits).ipv6_ip & 1U) != 0) {
        pcVar4 = "]";
      }
      pcVar5 = "";
      if (((data->state).slash_removed & 1U) != 0) {
        pcVar5 = "/";
      }
      type._4_8_ = curl_maprintf("%s://%s%s%s:%hu%s%s%s",conn->given->scheme,pcVar3,
                                 (conn->host).name,pcVar4,(ulong)(uint)conn->remote_port,pcVar5,
                                 (data->state).path,(long)&rest + 4);
      if ((char *)type._4_8_ == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      if (((data->change).url_alloc & 1U) != 0) {
        (*Curl_cfree)((data->change).url);
        (data->change).url = (char *)0x0;
        (data->change).url_alloc = false;
      }
      (data->change).url = (char *)type._4_8_;
      (data->change).url_alloc = true;
    }
  }
  if (conn->remote_port < 0) {
    conn->remote_port = (uint)conn->given->defport & 0xffff;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode parse_remote_port(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  char *portptr;
  char endbracket;

  /* Note that at this point, the IPv6 address cannot contain any scope
     suffix as that has already been removed in the parseurlandfillconn()
     function */
  if((1 == sscanf(conn->host.name, "[%*45[0123456789abcdefABCDEF:.]%c",
                  &endbracket)) &&
     (']' == endbracket)) {
    /* this is a RFC2732-style specified IP-address */
    conn->bits.ipv6_ip = TRUE;

    conn->host.name++; /* skip over the starting bracket */
    portptr = strchr(conn->host.name, ']');
    if(portptr) {
      *portptr++ = '\0'; /* zero terminate, killing the bracket */
      if(':' != *portptr)
        portptr = NULL; /* no port number available */
    }
  }
  else {
#ifdef ENABLE_IPV6
    struct in6_addr in6;
    if(Curl_inet_pton(AF_INET6, conn->host.name, &in6) > 0) {
      /* This is a numerical IPv6 address, meaning this is a wrongly formatted
         URL */
      failf(data, "IPv6 numerical address used in URL without brackets");
      return CURLE_URL_MALFORMAT;
    }
#endif

    portptr = strrchr(conn->host.name, ':');
  }

  if(data->set.use_port && data->state.allow_port) {
    /* if set, we use this and ignore the port possibly given in the URL */
    conn->remote_port = (unsigned short)data->set.use_port;
    if(portptr)
      *portptr = '\0'; /* cut off the name there anyway - if there was a port
                      number - since the port number is to be ignored! */
    if(conn->bits.httpproxy) {
      /* we need to create new URL with the new port number */
      char *url;
      char type[12]="";

      if(conn->bits.type_set)
        snprintf(type, sizeof(type), ";type=%c",
                 data->set.prefer_ascii?'A':
                 (data->set.ftp_list_only?'D':'I'));

      /*
       * This synthesized URL isn't always right--suffixes like ;type=A are
       * stripped off. It would be better to work directly from the original
       * URL and simply replace the port part of it.
       */
      url = aprintf("%s://%s%s%s:%hu%s%s%s", conn->given->scheme,
                    conn->bits.ipv6_ip?"[":"", conn->host.name,
                    conn->bits.ipv6_ip?"]":"", conn->remote_port,
                    data->state.slash_removed?"/":"", data->state.path,
                    type);
      if(!url)
        return CURLE_OUT_OF_MEMORY;

      if(data->change.url_alloc) {
        Curl_safefree(data->change.url);
        data->change.url_alloc = FALSE;
      }

      data->change.url = url;
      data->change.url_alloc = TRUE;
    }
  }
  else if(portptr) {
    /* no CURLOPT_PORT given, extract the one from the URL */

    char *rest;
    long port;

    port=strtol(portptr+1, &rest, 10);  /* Port number must be decimal */

    if((port < 0) || (port > 0xffff)) {
      /* Single unix standard says port numbers are 16 bits long */
      failf(data, "Port number out of range");
      return CURLE_URL_MALFORMAT;
    }

    else if(rest != &portptr[1]) {
      *portptr = '\0'; /* cut off the name there */
      conn->remote_port = curlx_ultous(port);
    }
    else
      /* Browser behavior adaptation. If there's a colon with no digits after,
         just cut off the name there which makes us ignore the colon and just
         use the default port. Firefox and Chrome both do that. */
      *portptr = '\0';
  }

  /* only if remote_port was not already parsed off the URL we use the
     default port number */
  if(conn->remote_port < 0)
    conn->remote_port = (unsigned short)conn->given->defport;

  return CURLE_OK;
}